

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hashes.h
# Opt level: O0

void rmd256(void *key,int len,uint32_t seed,void *out)

{
  uint in_EDX;
  unsigned_long in_RDI;
  
  rmd256_init((hash_state *)0x112fa1);
  ltc_state.rmd128.state[0] = in_EDX ^ 0x67452301;
  rmd256_process((hash_state *)CONCAT44(len,seed),(uchar *)out,in_RDI);
  rmd256_done((hash_state *)CONCAT44(len,seed),(uchar *)out);
  return;
}

Assistant:

inline void rmd256(const void *key, int len, uint32_t seed, void *out)
{
  // objsize
  rmd256_init(&ltc_state);
  ltc_state.rmd256.state[0] = 0x67452301UL ^ seed;
  rmd256_process(&ltc_state, (unsigned char *)key, len);
  rmd256_done(&ltc_state, (unsigned char *)out);
}